

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TextTrieMap::search
          (TextTrieMap *this,CharacterNode *node,UnicodeString *text,int32_t start,int32_t index,
          TextTrieMapSearchResultHandler *handler,UErrorCode *status)

{
  char16_t cVar1;
  int iVar2;
  uint ch;
  undefined4 uVar3;
  int offset;
  UnicodeString tmp;
  UnicodeString local_70;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((node->fValues == (void *)0x0 ||
      ((iVar2 = (**handler->_vptr_TextTrieMapSearchResultHandler)
                          (handler,(ulong)(uint)(index - start),node,status), (char)iVar2 != '\0' &&
       (*status < U_ILLEGAL_ARGUMENT_ERROR)))))) {
    if (this->fIgnoreCase == '\0') {
      iVar2 = index + 1;
      cVar1 = UnicodeString::doCharAt(text,index);
      node = getChildNode(this,node,cVar1);
    }
    else {
      ch = UnicodeString::char32At(text,index);
      UnicodeString::UnicodeString(&local_70,ch);
      UnicodeString::foldCase(&local_70,0);
      iVar2 = (index - (uint)(ch < 0x10000)) + 2;
      offset = 0;
      do {
        uVar3 = local_70.fUnion.fFields.fLength;
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if ((int)uVar3 <= offset) goto LAB_00209cc0;
        cVar1 = UnicodeString::doCharAt(&local_70,offset);
        offset = offset + 1;
        node = getChildNode(this,node,cVar1);
      } while (node != (CharacterNode *)0x0);
      node = (CharacterNode *)0x0;
LAB_00209cc0:
      UnicodeString::~UnicodeString(&local_70);
    }
    if (node != (CharacterNode *)0x0) {
      search(this,node,text,start,iVar2,handler,status);
    }
  }
  return;
}

Assistant:

void
TextTrieMap::search(CharacterNode *node, const UnicodeString &text, int32_t start,
                  int32_t index, TextTrieMapSearchResultHandler *handler, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return;
    }
    if (node->hasValues()) {
        if (!handler->handleMatch(index - start, node, status)) {
            return;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (fIgnoreCase) {
        // for folding we need to get a complete code point.
        // size of character may grow after fold operation;
        // then we need to get result as UTF16 code units.
        UChar32 c32 = text.char32At(index);
        index += U16_LENGTH(c32);
        UnicodeString tmp(c32);
        tmp.foldCase();
        int32_t tmpidx = 0;
        while (tmpidx < tmp.length()) {
            UChar c = tmp.charAt(tmpidx++);
            node = getChildNode(node, c);
            if (node == NULL) {
                break;
            }
        }
    } else {
        // here we just get the next UTF16 code unit
        UChar c = text.charAt(index++);
        node = getChildNode(node, c);
    }
    if (node != NULL) {
        search(node, text, start, index, handler, status);
    }
}